

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int call_on_client_hello_cb
              (ptls_t *tls,ptls_iovec_t server_name,ptls_iovec_t raw_message,
              ptls_iovec_t cipher_suites,ptls_iovec_t *alpns,size_t num_alpns,uint16_t *sig_algos,
              size_t num_sig_algos,uint16_t *cert_comp_algos,size_t num_cert_comp_algos,
              uint8_t *server_cert_types,size_t num_server_cert_types,
              ptls_client_hello_psk_identity_t *psk_identities,size_t num_psk_identities,
              int incompatible_version)

{
  undefined1 local_c8 [8];
  ptls_on_client_hello_parameters_t params;
  ptls_iovec_t *alpns_local;
  ptls_t *tls_local;
  ptls_iovec_t raw_message_local;
  ptls_iovec_t server_name_local;
  
  params.server_name.base = (uint8_t *)server_name.len;
  local_c8 = (undefined1  [8])server_name.base;
  params.raw_message.base = (uint8_t *)raw_message.len;
  params.server_name.len = (size_t)raw_message.base;
  if (tls->ctx->on_client_hello == (ptls_on_client_hello_t *)0x0) {
    server_name_local.len._4_4_ = 0;
  }
  else {
    params.raw_message.len = (size_t)cipher_suites.base;
    params.cipher_suites.base = (uint8_t *)cipher_suites.len;
    params.negotiated_protocols.list = (ptls_iovec_t *)num_alpns;
    params.negotiated_protocols.count = (size_t)sig_algos;
    params.signature_algorithms.list = (uint16_t *)num_sig_algos;
    params.signature_algorithms.count = (size_t)cert_comp_algos;
    params.certificate_compression_algorithms.list = (uint16_t *)num_cert_comp_algos;
    params.certificate_compression_algorithms.count = (size_t)server_cert_types;
    params.server_certificate_types.list = (uint8_t *)num_server_cert_types;
    params.server_certificate_types.count = (size_t)psk_identities;
    params.psk_identities.list = (ptls_client_hello_psk_identity_t *)num_psk_identities;
    params.psk_identities.count._0_1_ =
         (byte)params.psk_identities.count & 0xfe | (byte)incompatible_version & 1;
    params.cipher_suites.len = (size_t)alpns;
    params._128_8_ = alpns;
    server_name_local.len._4_4_ =
         (*tls->ctx->on_client_hello->cb)
                   (tls->ctx->on_client_hello,tls,(ptls_on_client_hello_parameters_t *)local_c8);
  }
  return server_name_local.len._4_4_;
}

Assistant:

static inline int call_on_client_hello_cb(ptls_t *tls, ptls_iovec_t server_name, ptls_iovec_t raw_message,
                                          ptls_iovec_t cipher_suites, ptls_iovec_t *alpns, size_t num_alpns,
                                          const uint16_t *sig_algos, size_t num_sig_algos, const uint16_t *cert_comp_algos,
                                          size_t num_cert_comp_algos, const uint8_t *server_cert_types,
                                          size_t num_server_cert_types, const ptls_client_hello_psk_identity_t *psk_identities,
                                          size_t num_psk_identities, int incompatible_version)
{
    if (tls->ctx->on_client_hello == NULL)
        return 0;

    ptls_on_client_hello_parameters_t params = {server_name,
                                                raw_message,
                                                cipher_suites,
                                                {alpns, num_alpns},
                                                {sig_algos, num_sig_algos},
                                                {cert_comp_algos, num_cert_comp_algos},
                                                {server_cert_types, num_server_cert_types},
                                                {psk_identities, num_psk_identities},
                                                incompatible_version};
    return tls->ctx->on_client_hello->cb(tls->ctx->on_client_hello, tls, &params);
}